

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

int despot::POMCP::Count(VNode *vnode)

{
  int iVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar2;
  QNode *this;
  int iVar3;
  ulong uVar4;
  
  pvVar2 = VNode::children(vnode);
  if ((pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      this = VNode::Child(vnode,(ACT_TYPE)uVar4);
      iVar1 = QNode::count(this);
      iVar3 = iVar3 + iVar1;
      uVar4 = uVar4 + 1;
      pvVar2 = VNode::children(vnode);
    } while (uVar4 < (ulong)((long)(pvVar2->
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar2->
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return iVar3;
}

Assistant:

int POMCP::Count(const VNode* vnode) {
	int count = 0;
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++)
		count += vnode->Child(action)->count();
	return count;
}